

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2_semi_mgau.c
# Opt level: O2

int s2_semi_mgau_frame_eval
              (ps_mgau_t *ps,int16 *senone_scores,uint8 *senone_active,int32 n_senone_active,
              mfcc_t **featbuf,int32 frame,int32 compallsen)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  mfcc_t *pmVar8;
  char *pcVar9;
  undefined8 *puVar10;
  int *piVar11;
  float *pfVar12;
  char *pcVar13;
  byte bVar14;
  byte bVar15;
  int32 j_1;
  long lVar16;
  ps_mgaufuncs_t *ppVar17;
  uint uVar18;
  uint uVar19;
  float *pfVar20;
  ulong uVar21;
  ushort uVar22;
  long lVar23;
  int *piVar24;
  long lVar25;
  long lVar26;
  ulong uVar27;
  ulong uVar28;
  int iVar29;
  long lVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  long lVar34;
  int iVar35;
  logadd_t *t;
  long lVar36;
  byte bVar37;
  byte bVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  uint8 w_den [5] [16];
  byte abStack_78 [16];
  long local_68;
  int local_5c;
  mfcc_t **local_58;
  int *local_50;
  ulong local_48;
  long local_40;
  float *local_38;
  
  uVar18 = *(uint *)(*(long *)&ps[1].frame_idx + 0x24);
  local_58 = featbuf;
  memset(senone_scores,0,(long)ps[3].frame_idx * 2);
  local_5c = frame % ps[6].frame_idx;
  if (n_senone_active < 1) {
    n_senone_active = 0;
  }
  uVar41 = (ulong)(uint)n_senone_active;
  local_68 = (long)local_5c;
  local_48 = (ulong)uVar18;
  if ((int)uVar18 < 1) {
    local_48 = 0;
  }
  ps[6].vt = (ps_mgaufuncs_t *)(&(ps[5].vt)->name)[local_5c];
  uVar28 = 0;
  do {
    if (uVar28 == local_48) {
      return 0;
    }
    if (ps->frame_idx <= frame) {
      lVar16 = local_68;
      if (local_5c == 0) {
        lVar16 = (long)ps[6].frame_idx;
      }
      memcpy((&(ps[6].vt)->name)[uVar28],
             *(void **)(*(long *)((long)ps[5].vt + lVar16 * 8 + -8) + uVar28 * 8),
             (long)(short)ps[4].frame_idx << 3);
      pmVar8 = local_58[uVar28];
      pcVar9 = (&(ps[6].vt)->name)[uVar28];
      iVar33 = *(int *)(*(long *)(*(long *)&ps[1].frame_idx + 0x30) + uVar28 * 4);
      iVar42 = 0;
      if (0 < iVar33) {
        iVar42 = iVar33;
      }
      for (lVar16 = 0; lVar25 = (long)(short)ps[4].frame_idx, lVar16 < lVar25; lVar16 = lVar16 + 1)
      {
        iVar39 = *(int *)(pcVar9 + lVar16 * 8 + 4);
        puVar10 = *(undefined8 **)&ps[1].frame_idx;
        lVar25 = (long)(iVar39 * iVar33) * 4;
        fVar44 = *(float *)(*(long *)(*(long *)puVar10[2] + uVar28 * 8) + (long)iVar39 * 4);
        for (lVar34 = 0; iVar42 != (int)lVar34; lVar34 = lVar34 + 1) {
          fVar45 = (float)pmVar8[lVar34] -
                   *(float *)(**(long **)(*(long *)*puVar10 + uVar28 * 8) + lVar25 + lVar34 * 4);
          fVar44 = fVar44 - fVar45 * fVar45 *
                            *(float *)(lVar25 + **(long **)(*(long *)puVar10[1] + uVar28 * 8) +
                                      lVar34 * 4);
        }
        fVar45 = -2.1474836e+09;
        if (-2.1474836e+09 <= fVar44) {
          fVar45 = fVar44;
        }
        iVar29 = (int)fVar45;
        *(int *)(pcVar9 + lVar16 * 8) = iVar29;
        lVar25 = lVar16;
        if (lVar16 != 0) {
          for (; 0 < lVar25; lVar25 = lVar25 + -1) {
            if (iVar29 <= *(int *)(pcVar9 + lVar25 * 8 + -8)) goto LAB_0013ae3e;
            *(undefined8 *)(pcVar9 + lVar25 * 8) = *(undefined8 *)(pcVar9 + lVar25 * 8 + -8);
          }
          lVar25 = 0;
LAB_0013ae3e:
          *(int *)(pcVar9 + (long)(int)lVar25 * 8) = iVar29;
          *(int *)(pcVar9 + (long)(int)lVar25 * 8 + 4) = iVar39;
        }
      }
      ppVar17 = ps[6].vt;
      if (frame % (int)*(short *)((long)&ps[4].frame_idx + 2) == 0) {
        piVar11 = (int *)(&ppVar17->name)[uVar28];
        puVar10 = *(undefined8 **)&ps[1].frame_idx;
        pfVar12 = *(float **)(*(long *)puVar10[2] + uVar28 * 8);
        iVar33 = *(int *)(puVar10 + 5);
        local_38 = pfVar12 + iVar33;
        uVar18 = *(uint *)(puVar10[6] + uVar28 * 4);
        local_50 = piVar11 + lVar25 * 2 + -4;
        local_40 = (long)(int)uVar18;
        uVar31 = 0;
        if (0 < (int)uVar18) {
          uVar31 = (ulong)uVar18;
        }
        pfVar20 = pfVar12;
        lVar16 = **(long **)(*(long *)*puVar10 + uVar28 * 8);
        lVar34 = **(long **)(*(long *)puVar10[1] + uVar28 * 8);
LAB_0013aee7:
        if (pfVar20 < pfVar12 + iVar33) {
          fVar44 = *pfVar20;
          lVar36 = lVar34 + uVar31 * 4;
          lVar26 = lVar16 + uVar31 * 4;
          lVar23 = 0;
          for (lVar30 = 0; (int)uVar31 != (int)lVar30; lVar30 = lVar30 + 1) {
            if (fVar44 < (float)piVar11[lVar25 * 2 + -2]) {
              lVar30 = (int)uVar18 - lVar30;
              lVar26 = (lVar16 - lVar23) + lVar30 * 4;
              lVar36 = (lVar34 - lVar23) + lVar30 * 4;
              goto LAB_0013afc0;
            }
            fVar45 = (float)pmVar8[lVar30] - *(float *)(lVar16 + lVar30 * 4);
            fVar44 = fVar44 - fVar45 * fVar45 * *(float *)(lVar34 + lVar30 * 4);
            lVar23 = lVar23 + -4;
          }
          fVar45 = -2.1474836e+09;
          if (-2.1474836e+09 <= fVar44) {
            fVar45 = fVar44;
          }
          iVar42 = (int)fVar45;
          if (piVar11[lVar25 * 2 + -2] <= iVar42) {
            uVar22 = (ushort)ps[4].frame_idx;
            if ((short)uVar22 < 1) {
              uVar22 = 0;
            }
            uVar21 = 0;
            do {
              iVar39 = (int)((ulong)((long)pfVar20 - (long)pfVar12) >> 2);
              piVar24 = piVar11 + lVar25 * 2 + -4;
              if (uVar22 == uVar21) goto LAB_0013afa2;
              lVar16 = uVar21 * 2;
              uVar21 = uVar21 + 1;
            } while (piVar11[lVar16 + 1] != iVar39);
          }
          goto LAB_0013afc0;
        }
        ppVar17 = ps[6].vt;
      }
      piVar11 = (int *)(&ppVar17->name)[uVar28];
      iVar33 = *piVar11;
      for (lVar16 = 0; lVar16 < (short)ps[4].frame_idx; lVar16 = lVar16 + 1) {
        iVar42 = (iVar33 >> 10) - (piVar11[lVar16 * 2] >> 10);
        if (0x5f < iVar42) {
          iVar42 = 0x60;
        }
        piVar11[lVar16 * 2] = iVar42;
        bVar15 = *(byte *)((long)&(ps[4].vt)->name + uVar28);
        if ((bVar15 != 0) && ((int)(uint)bVar15 < iVar42)) break;
      }
      *(char *)(*(long *)(*(long *)&ps[5].frame_idx + local_68 * 8) + uVar28) = (char)lVar16;
    }
    ppVar17 = ps[3].vt;
    bVar15 = *(byte *)(*(long *)(*(long *)&ps[5].frame_idx + local_68 * 8) + uVar28);
    uVar31 = (ulong)bVar15;
    if (ppVar17 == (ps_mgaufuncs_t *)0x0) {
      if (compallsen == 0) {
        switch(bVar15) {
        case 1:
          pcVar9 = (&(ps[6].vt)->name)[uVar28];
          lVar16 = *(long *)((&(ps[2].vt)->name)[uVar28] + (long)*(int *)(pcVar9 + 4) * 8);
          uVar21 = 0;
          for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
            uVar21 = (uVar21 & 0xffffffff) + (ulong)senone_active[uVar31];
            senone_scores[uVar21] =
                 senone_scores[uVar21] +
                 (ushort)*(byte *)(lVar16 + uVar21) + (short)*(undefined4 *)pcVar9;
          }
          break;
        case 2:
          pcVar9 = (&(ps[2].vt)->name)[uVar28];
          piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
          lVar16 = *(long *)(pcVar9 + (long)piVar11[1] * 8);
          lVar25 = *(long *)(pcVar9 + (long)piVar11[3] * 8);
          uVar21 = 0;
          for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
            uVar21 = (uVar21 & 0xffffffff) + (ulong)senone_active[uVar31];
            iVar42 = (uint)*(byte *)(lVar16 + uVar21) + *piVar11;
            iVar33 = (uint)*(byte *)(lVar25 + uVar21) + piVar11[2];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            senone_scores[uVar21] =
                 senone_scores[uVar21] + ((short)iVar33 - (ushort)(byte)(ps[7].vt)->name[uVar43]);
          }
          break;
        case 3:
          pcVar9 = (&(ps[2].vt)->name)[uVar28];
          piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
          lVar16 = *(long *)(pcVar9 + (long)piVar11[1] * 8);
          lVar25 = *(long *)(pcVar9 + (long)piVar11[3] * 8);
          lVar34 = *(long *)(pcVar9 + (long)piVar11[5] * 8);
          uVar21 = 0;
          for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
            uVar21 = (uVar21 & 0xffffffff) + (ulong)senone_active[uVar31];
            iVar42 = (uint)*(byte *)(lVar16 + uVar21) + *piVar11;
            iVar33 = (uint)*(byte *)(lVar25 + uVar21) + piVar11[2];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            pcVar9 = (ps[7].vt)->name;
            iVar33 = iVar33 - (uint)(byte)pcVar9[uVar43];
            iVar42 = (uint)*(byte *)(lVar34 + uVar21) + piVar11[4];
            uVar18 = iVar33 - iVar42;
            if (iVar33 < iVar42) {
              iVar42 = iVar33;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            senone_scores[uVar21] =
                 senone_scores[uVar21] + ((short)iVar42 - (ushort)(byte)pcVar9[uVar43]);
          }
          break;
        case 4:
          pcVar9 = (&(ps[2].vt)->name)[uVar28];
          piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
          lVar16 = *(long *)(pcVar9 + (long)piVar11[1] * 8);
          lVar25 = *(long *)(pcVar9 + (long)piVar11[3] * 8);
          lVar34 = *(long *)(pcVar9 + (long)piVar11[5] * 8);
          lVar26 = *(long *)(pcVar9 + (long)piVar11[7] * 8);
          uVar21 = 0;
          for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
            uVar21 = (uVar21 & 0xffffffff) + (ulong)senone_active[uVar31];
            iVar42 = (uint)*(byte *)(lVar16 + uVar21) + *piVar11;
            iVar33 = (uint)*(byte *)(lVar25 + uVar21) + piVar11[2];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            pcVar9 = (ps[7].vt)->name;
            iVar33 = iVar33 - (uint)(byte)pcVar9[uVar43];
            iVar42 = (uint)*(byte *)(lVar34 + uVar21) + piVar11[4];
            uVar18 = iVar33 - iVar42;
            if (iVar33 < iVar42) {
              iVar42 = iVar33;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            iVar42 = iVar42 - (uint)(byte)pcVar9[uVar43];
            iVar33 = (uint)*(byte *)(lVar26 + uVar21) + piVar11[6];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            senone_scores[uVar21] =
                 senone_scores[uVar21] + ((short)iVar33 - (ushort)(byte)pcVar9[uVar43]);
          }
          break;
        case 5:
          pcVar9 = (&(ps[2].vt)->name)[uVar28];
          piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
          lVar16 = *(long *)(pcVar9 + (long)piVar11[1] * 8);
          lVar25 = *(long *)(pcVar9 + (long)piVar11[3] * 8);
          lVar34 = *(long *)(pcVar9 + (long)piVar11[5] * 8);
          lVar26 = *(long *)(pcVar9 + (long)piVar11[7] * 8);
          lVar36 = *(long *)(pcVar9 + (long)piVar11[9] * 8);
          uVar21 = 0;
          for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
            uVar21 = (uVar21 & 0xffffffff) + (ulong)senone_active[uVar31];
            iVar42 = (uint)*(byte *)(lVar16 + uVar21) + *piVar11;
            iVar33 = (uint)*(byte *)(lVar25 + uVar21) + piVar11[2];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            pcVar9 = (ps[7].vt)->name;
            iVar33 = iVar33 - (uint)(byte)pcVar9[uVar43];
            iVar42 = (uint)*(byte *)(lVar34 + uVar21) + piVar11[4];
            uVar18 = iVar33 - iVar42;
            if (iVar33 < iVar42) {
              iVar42 = iVar33;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            iVar42 = iVar42 - (uint)(byte)pcVar9[uVar43];
            iVar33 = (uint)*(byte *)(lVar26 + uVar21) + piVar11[6];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            iVar33 = iVar33 - (uint)(byte)pcVar9[uVar43];
            iVar42 = (uint)*(byte *)(lVar36 + uVar21) + piVar11[8];
            uVar18 = iVar33 - iVar42;
            if (iVar33 < iVar42) {
              iVar42 = iVar33;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            senone_scores[uVar21] =
                 senone_scores[uVar21] + ((short)iVar42 - (ushort)(byte)pcVar9[uVar43]);
          }
          break;
        case 6:
          pcVar9 = (&(ps[2].vt)->name)[uVar28];
          piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
          lVar16 = *(long *)(pcVar9 + (long)piVar11[1] * 8);
          lVar25 = *(long *)(pcVar9 + (long)piVar11[3] * 8);
          lVar34 = *(long *)(pcVar9 + (long)piVar11[5] * 8);
          lVar26 = *(long *)(pcVar9 + (long)piVar11[7] * 8);
          lVar36 = *(long *)(pcVar9 + (long)piVar11[9] * 8);
          lVar30 = *(long *)(pcVar9 + (long)piVar11[0xb] * 8);
          uVar21 = 0;
          for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
            uVar21 = (uVar21 & 0xffffffff) + (ulong)senone_active[uVar31];
            iVar42 = (uint)*(byte *)(lVar16 + uVar21) + *piVar11;
            iVar33 = (uint)*(byte *)(lVar25 + uVar21) + piVar11[2];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            pcVar9 = (ps[7].vt)->name;
            iVar33 = iVar33 - (uint)(byte)pcVar9[uVar43];
            iVar42 = (uint)*(byte *)(lVar34 + uVar21) + piVar11[4];
            uVar18 = iVar33 - iVar42;
            if (iVar33 < iVar42) {
              iVar42 = iVar33;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            iVar42 = iVar42 - (uint)(byte)pcVar9[uVar43];
            iVar33 = (uint)*(byte *)(lVar26 + uVar21) + piVar11[6];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            iVar33 = iVar33 - (uint)(byte)pcVar9[uVar43];
            iVar42 = (uint)*(byte *)(lVar36 + uVar21) + piVar11[8];
            uVar18 = iVar33 - iVar42;
            if (iVar33 < iVar42) {
              iVar42 = iVar33;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            iVar42 = iVar42 - (uint)(byte)pcVar9[uVar43];
            iVar33 = (uint)*(byte *)(lVar30 + uVar21) + piVar11[10];
            uVar18 = iVar42 - iVar33;
            if (iVar42 < iVar33) {
              iVar33 = iVar42;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            senone_scores[uVar21] =
                 senone_scores[uVar21] + ((short)iVar33 - (ushort)(byte)pcVar9[uVar43]);
          }
          break;
        default:
          uVar32 = 0;
          for (uVar21 = 0; uVar21 != uVar41; uVar21 = uVar21 + 1) {
            uVar32 = (uVar32 & 0xffffffff) + (ulong)senone_active[uVar21];
            pcVar9 = (&(ps[2].vt)->name)[uVar28];
            piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
            iVar33 = (uint)*(byte *)(*(long *)(pcVar9 + (long)piVar11[1] * 8) + uVar32) + *piVar11;
            for (uVar27 = 1; uVar27 < uVar31; uVar27 = uVar27 + 1) {
              iVar42 = (uint)*(byte *)(*(long *)(pcVar9 + (long)piVar11[uVar27 * 2 + 1] * 8) +
                                      uVar32) + piVar11[uVar27 * 2];
              uVar18 = iVar33 - iVar42;
              if (iVar33 < iVar42) {
                iVar42 = iVar33;
              }
              uVar43 = -uVar18;
              if (0 < (int)uVar18) {
                uVar43 = uVar18;
              }
              iVar33 = iVar42 - (uint)(byte)(ps[7].vt)->name[uVar43];
            }
            senone_scores[uVar32] = senone_scores[uVar32] + (short)iVar33;
          }
        }
      }
      else {
        uVar21 = (ulong)(uint)ps[3].frame_idx;
        if (ps[3].frame_idx < 1) {
          uVar21 = 0;
        }
        for (uVar32 = 0; uVar32 != uVar21; uVar32 = uVar32 + 1) {
          pcVar9 = (&(ps[2].vt)->name)[uVar28];
          piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
          iVar33 = (uint)*(byte *)(*(long *)(pcVar9 + (long)piVar11[1] * 8) + uVar32) + *piVar11;
          for (uVar27 = 1; uVar27 < uVar31; uVar27 = uVar27 + 1) {
            iVar42 = (uint)*(byte *)(*(long *)(pcVar9 + (long)piVar11[uVar27 * 2 + 1] * 8) + uVar32)
                     + piVar11[uVar27 * 2];
            uVar18 = iVar33 - iVar42;
            if (iVar33 < iVar42) {
              iVar42 = iVar33;
            }
            uVar43 = -uVar18;
            if (0 < (int)uVar18) {
              uVar43 = uVar18;
            }
            iVar33 = iVar42 - (uint)(byte)(ps[7].vt)->name[uVar43];
          }
          senone_scores[uVar32] = senone_scores[uVar32] + (short)iVar33;
        }
      }
    }
    else if (compallsen == 0) {
      switch(bVar15) {
      case 1:
        pcVar9 = (&(ps[6].vt)->name)[uVar28];
        cVar1 = *pcVar9;
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          w_den[0][lVar16] = *(char *)((long)&ppVar17->name + lVar16) + cVar1;
        }
        lVar16 = *(long *)((&(ps[2].vt)->name)[uVar28] + (long)*(int *)(pcVar9 + 4) * 8);
        uVar21 = 0;
        for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
          uVar18 = (int)uVar21 + (uint)senone_active[uVar31];
          uVar21 = (ulong)uVar18;
          bVar15 = *(byte *)(lVar16 + (ulong)(uVar18 >> 1));
          bVar38 = bVar15 >> 4;
          if ((uVar18 & 1) == 0) {
            bVar38 = bVar15 & 0xf;
          }
          senone_scores[uVar21] = senone_scores[uVar21] + (ushort)w_den[0][bVar38];
        }
        break;
      case 2:
        pcVar9 = (&(ps[6].vt)->name)[uVar28];
        cVar1 = *pcVar9;
        cVar2 = pcVar9[8];
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          cVar3 = *(char *)((long)&ppVar17->name + lVar16);
          w_den[0][lVar16] = cVar3 + cVar1;
          w_den[1][lVar16] = cVar3 + cVar2;
        }
        pcVar13 = (&(ps[2].vt)->name)[uVar28];
        lVar16 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 4) * 8);
        lVar25 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0xc) * 8);
        uVar21 = 0;
        for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
          uVar18 = (int)uVar21 + (uint)senone_active[uVar31];
          uVar21 = (ulong)uVar18;
          bVar15 = *(byte *)(lVar16 + (ulong)(uVar18 >> 1));
          bVar38 = *(byte *)(lVar25 + (ulong)(uVar18 >> 1));
          bVar37 = bVar15 >> 4;
          bVar14 = bVar38 >> 4;
          if ((uVar18 & 1) == 0) {
            bVar37 = bVar15 & 0xf;
            bVar14 = bVar38 & 0xf;
          }
          bVar15 = w_den[1][bVar14];
          uVar43 = (uint)w_den[0][bVar37];
          uVar40 = uVar43 - bVar15;
          uVar18 = (uint)bVar15;
          if (uVar43 < bVar15) {
            uVar18 = uVar43;
          }
          uVar43 = -uVar40;
          if (0 < (int)uVar40) {
            uVar43 = uVar40;
          }
          senone_scores[uVar21] =
               senone_scores[uVar21] +
               ((short)uVar18 - (ushort)(byte)(ps[7].vt)->name[uVar43 & 0xff]);
        }
        break;
      case 3:
        pcVar9 = (&(ps[6].vt)->name)[uVar28];
        cVar1 = *pcVar9;
        cVar2 = pcVar9[8];
        cVar3 = pcVar9[0x10];
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          cVar4 = *(char *)((long)&ppVar17->name + lVar16);
          w_den[0][lVar16] = cVar4 + cVar1;
          w_den[1][lVar16] = cVar4 + cVar2;
          w_den[2][lVar16] = cVar4 + cVar3;
        }
        pcVar13 = (&(ps[2].vt)->name)[uVar28];
        lVar16 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 4) * 8);
        lVar25 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0xc) * 8);
        lVar34 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x14) * 8);
        uVar18 = 0;
        for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
          uVar18 = uVar18 + senone_active[uVar31];
          uVar21 = (ulong)(uVar18 >> 1);
          pcVar9 = (ps[7].vt)->name;
          if ((uVar18 & 1) == 0) {
            bVar15 = w_den[0][*(byte *)(lVar16 + uVar21) & 0xf];
            bVar38 = w_den[1][*(byte *)(lVar25 + uVar21) & 0xf];
            iVar33 = (uint)bVar15 - (uint)bVar38;
            if ((uint)bVar15 < (uint)bVar38) {
              bVar38 = bVar15;
            }
            bVar15 = (byte)iVar33;
            bVar37 = -bVar15;
            if (0 < iVar33) {
              bVar37 = bVar15;
            }
            uVar43 = (uint)bVar38 - (uint)(byte)pcVar9[bVar37];
            bVar15 = *(byte *)(lVar34 + uVar21) & 0xf;
          }
          else {
            bVar15 = w_den[0][*(byte *)(lVar16 + uVar21) >> 4];
            bVar38 = w_den[1][*(byte *)(lVar25 + uVar21) >> 4];
            iVar33 = (uint)bVar15 - (uint)bVar38;
            if ((uint)bVar15 < (uint)bVar38) {
              bVar38 = bVar15;
            }
            bVar15 = (byte)iVar33;
            bVar37 = -bVar15;
            if (0 < iVar33) {
              bVar37 = bVar15;
            }
            uVar43 = (uint)bVar38 - (uint)(byte)pcVar9[bVar37];
            bVar15 = *(byte *)(lVar34 + uVar21) >> 4;
          }
          bVar15 = w_den[2][bVar15];
          uVar19 = uVar43 - bVar15;
          uVar40 = (uint)bVar15;
          if ((int)uVar43 < (int)(uint)bVar15) {
            uVar40 = uVar43;
          }
          uVar43 = -uVar19;
          if (0 < (int)uVar19) {
            uVar43 = uVar19;
          }
          senone_scores[uVar18] =
               senone_scores[uVar18] + ((short)uVar40 - (ushort)(byte)pcVar9[uVar43]);
        }
        break;
      case 4:
        pcVar9 = (&(ps[6].vt)->name)[uVar28];
        cVar1 = *pcVar9;
        cVar2 = pcVar9[8];
        cVar3 = pcVar9[0x10];
        cVar4 = pcVar9[0x18];
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          cVar5 = *(char *)((long)&ppVar17->name + lVar16);
          w_den[0][lVar16] = cVar5 + cVar1;
          w_den[1][lVar16] = cVar5 + cVar2;
          w_den[2][lVar16] = cVar5 + cVar3;
          w_den[3][lVar16] = cVar5 + cVar4;
        }
        pcVar13 = (&(ps[2].vt)->name)[uVar28];
        lVar16 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 4) * 8);
        lVar25 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0xc) * 8);
        lVar34 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x14) * 8);
        lVar26 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x1c) * 8);
        uVar18 = 0;
        for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
          uVar18 = uVar18 + senone_active[uVar31];
          uVar21 = (ulong)(uVar18 >> 1);
          pcVar9 = (ps[7].vt)->name;
          if ((uVar18 & 1) == 0) {
            bVar15 = w_den[1][*(byte *)(lVar25 + uVar21) & 0xf];
            uVar40 = (uint)w_den[0][*(byte *)(lVar16 + uVar21) & 0xf];
            iVar33 = uVar40 - bVar15;
            uVar43 = (uint)bVar15;
            if (uVar40 < bVar15) {
              uVar43 = uVar40;
            }
            bVar15 = (byte)iVar33;
            bVar38 = -bVar15;
            if (0 < iVar33) {
              bVar38 = bVar15;
            }
            uVar43 = uVar43 - (byte)pcVar9[bVar38];
            bVar15 = w_den[2][*(byte *)(lVar34 + uVar21) & 0xf];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = *(byte *)(lVar26 + uVar21) & 0xf;
          }
          else {
            bVar15 = w_den[1][*(byte *)(lVar25 + uVar21) >> 4];
            uVar40 = (uint)w_den[0][*(byte *)(lVar16 + uVar21) >> 4];
            iVar33 = uVar40 - bVar15;
            uVar43 = (uint)bVar15;
            if (uVar40 < bVar15) {
              uVar43 = uVar40;
            }
            bVar15 = (byte)iVar33;
            bVar38 = -bVar15;
            if (0 < iVar33) {
              bVar38 = bVar15;
            }
            uVar43 = uVar43 - (byte)pcVar9[bVar38];
            bVar15 = w_den[2][*(byte *)(lVar34 + uVar21) >> 4];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = *(byte *)(lVar26 + uVar21) >> 4;
          }
          bVar15 = w_den[3][bVar15];
          uVar19 = uVar43 - bVar15;
          uVar40 = (uint)bVar15;
          if ((int)uVar43 < (int)(uint)bVar15) {
            uVar40 = uVar43;
          }
          uVar43 = -uVar19;
          if (0 < (int)uVar19) {
            uVar43 = uVar19;
          }
          senone_scores[uVar18] =
               senone_scores[uVar18] + ((short)uVar40 - (ushort)(byte)pcVar9[uVar43]);
        }
        break;
      case 5:
        pcVar9 = (&(ps[6].vt)->name)[uVar28];
        cVar1 = *pcVar9;
        cVar2 = pcVar9[8];
        cVar3 = pcVar9[0x10];
        cVar4 = pcVar9[0x18];
        cVar5 = pcVar9[0x20];
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          cVar6 = *(char *)((long)&ppVar17->name + lVar16);
          w_den[0][lVar16] = cVar6 + cVar1;
          w_den[1][lVar16] = cVar6 + cVar2;
          w_den[2][lVar16] = cVar6 + cVar3;
          w_den[3][lVar16] = cVar6 + cVar4;
          w_den[4][lVar16] = cVar6 + cVar5;
        }
        pcVar13 = (&(ps[2].vt)->name)[uVar28];
        lVar16 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 4) * 8);
        lVar25 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0xc) * 8);
        lVar34 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x14) * 8);
        lVar26 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x1c) * 8);
        lVar36 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x24) * 8);
        uVar18 = 0;
        for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
          uVar18 = uVar18 + senone_active[uVar31];
          uVar21 = (ulong)(uVar18 >> 1);
          pcVar9 = (ps[7].vt)->name;
          if ((uVar18 & 1) == 0) {
            bVar15 = w_den[0][*(byte *)(lVar16 + uVar21) & 0xf];
            bVar38 = w_den[1][*(byte *)(lVar25 + uVar21) & 0xf];
            iVar33 = (uint)bVar15 - (uint)bVar38;
            if ((uint)bVar15 < (uint)bVar38) {
              bVar38 = bVar15;
            }
            bVar15 = (byte)iVar33;
            bVar37 = -bVar15;
            if (0 < iVar33) {
              bVar37 = bVar15;
            }
            uVar43 = (uint)bVar38 - (uint)(byte)pcVar9[bVar37];
            bVar15 = w_den[2][*(byte *)(lVar34 + uVar21) & 0xf];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = w_den[3][*(byte *)(lVar26 + uVar21) & 0xf];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = *(byte *)(lVar36 + uVar21) & 0xf;
          }
          else {
            bVar15 = w_den[0][*(byte *)(lVar16 + uVar21) >> 4];
            bVar38 = w_den[1][*(byte *)(lVar25 + uVar21) >> 4];
            iVar33 = (uint)bVar15 - (uint)bVar38;
            if ((uint)bVar15 < (uint)bVar38) {
              bVar38 = bVar15;
            }
            bVar15 = (byte)iVar33;
            bVar37 = -bVar15;
            if (0 < iVar33) {
              bVar37 = bVar15;
            }
            uVar43 = (uint)bVar38 - (uint)(byte)pcVar9[bVar37];
            bVar15 = w_den[2][*(byte *)(lVar34 + uVar21) >> 4];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = w_den[3][*(byte *)(lVar26 + uVar21) >> 4];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = *(byte *)(lVar36 + uVar21) >> 4;
          }
          bVar15 = w_den[4][bVar15];
          uVar19 = uVar43 - bVar15;
          uVar40 = (uint)bVar15;
          if ((int)uVar43 < (int)(uint)bVar15) {
            uVar40 = uVar43;
          }
          uVar43 = -uVar19;
          if (0 < (int)uVar19) {
            uVar43 = uVar19;
          }
          senone_scores[uVar18] =
               senone_scores[uVar18] + ((short)uVar40 - (ushort)(byte)pcVar9[uVar43]);
        }
        break;
      case 6:
        pcVar9 = (&(ps[6].vt)->name)[uVar28];
        cVar1 = *pcVar9;
        cVar2 = pcVar9[8];
        cVar3 = pcVar9[0x10];
        cVar4 = pcVar9[0x18];
        cVar5 = pcVar9[0x20];
        cVar6 = pcVar9[0x28];
        for (lVar16 = 0; lVar16 != 0x10; lVar16 = lVar16 + 1) {
          cVar7 = *(char *)((long)&ppVar17->name + lVar16);
          w_den[0][lVar16] = cVar7 + cVar1;
          w_den[1][lVar16] = cVar7 + cVar2;
          w_den[2][lVar16] = cVar7 + cVar3;
          w_den[3][lVar16] = cVar7 + cVar4;
          w_den[4][lVar16] = cVar7 + cVar5;
          abStack_78[lVar16] = cVar7 + cVar6;
        }
        pcVar13 = (&(ps[2].vt)->name)[uVar28];
        lVar16 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 4) * 8);
        lVar25 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0xc) * 8);
        lVar34 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x14) * 8);
        lVar26 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x1c) * 8);
        lVar36 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x24) * 8);
        lVar30 = *(long *)(pcVar13 + (long)*(int *)(pcVar9 + 0x2c) * 8);
        uVar18 = 0;
        for (uVar31 = 0; uVar41 != uVar31; uVar31 = uVar31 + 1) {
          uVar18 = uVar18 + senone_active[uVar31];
          uVar21 = (ulong)(uVar18 >> 1);
          pcVar9 = (ps[7].vt)->name;
          if ((uVar18 & 1) == 0) {
            bVar15 = w_den[1][*(byte *)(lVar25 + uVar21) & 0xf];
            uVar40 = (uint)w_den[0][*(byte *)(lVar16 + uVar21) & 0xf];
            iVar33 = uVar40 - bVar15;
            uVar43 = (uint)bVar15;
            if (uVar40 < bVar15) {
              uVar43 = uVar40;
            }
            bVar15 = (byte)iVar33;
            bVar38 = -bVar15;
            if (0 < iVar33) {
              bVar38 = bVar15;
            }
            uVar43 = uVar43 - (byte)pcVar9[bVar38];
            bVar15 = w_den[2][*(byte *)(lVar34 + uVar21) & 0xf];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = w_den[3][*(byte *)(lVar26 + uVar21) & 0xf];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = w_den[4][*(byte *)(lVar36 + uVar21) & 0xf];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = *(byte *)(lVar30 + uVar21) & 0xf;
          }
          else {
            bVar15 = w_den[1][*(byte *)(lVar25 + uVar21) >> 4];
            uVar40 = (uint)w_den[0][*(byte *)(lVar16 + uVar21) >> 4];
            iVar33 = uVar40 - bVar15;
            uVar43 = (uint)bVar15;
            if (uVar40 < bVar15) {
              uVar43 = uVar40;
            }
            bVar15 = (byte)iVar33;
            bVar38 = -bVar15;
            if (0 < iVar33) {
              bVar38 = bVar15;
            }
            uVar43 = uVar43 - (byte)pcVar9[bVar38];
            bVar15 = w_den[2][*(byte *)(lVar34 + uVar21) >> 4];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = w_den[3][*(byte *)(lVar26 + uVar21) >> 4];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = w_den[4][*(byte *)(lVar36 + uVar21) >> 4];
            uVar40 = uVar43 - bVar15;
            if ((int)(uint)bVar15 <= (int)uVar43) {
              uVar43 = (uint)bVar15;
            }
            uVar19 = -uVar40;
            if (0 < (int)uVar40) {
              uVar19 = uVar40;
            }
            uVar43 = uVar43 - (byte)pcVar9[uVar19];
            bVar15 = *(byte *)(lVar30 + uVar21) >> 4;
          }
          bVar15 = abStack_78[bVar15];
          uVar19 = uVar43 - bVar15;
          uVar40 = (uint)bVar15;
          if ((int)uVar43 < (int)(uint)bVar15) {
            uVar40 = uVar43;
          }
          uVar43 = -uVar19;
          if (0 < (int)uVar19) {
            uVar43 = uVar19;
          }
          senone_scores[uVar18] =
               senone_scores[uVar18] + ((short)uVar40 - (ushort)(byte)pcVar9[uVar43]);
        }
        break;
      default:
        uVar18 = 0;
        for (uVar21 = 0; uVar21 != uVar41; uVar21 = uVar21 + 1) {
          uVar18 = uVar18 + senone_active[uVar21];
          pcVar9 = (&(ps[2].vt)->name)[uVar28];
          piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
          bVar15 = *(byte *)(*(long *)(pcVar9 + (long)piVar11[1] * 8) + (ulong)(uVar18 >> 1));
          bVar38 = bVar15 >> 4;
          if ((uVar18 & 1) == 0) {
            bVar38 = bVar15 & 0xf;
          }
          iVar33 = (uint)*(byte *)((long)&ppVar17->name + (ulong)bVar38) + *piVar11;
          for (uVar32 = 1; uVar32 < uVar31; uVar32 = uVar32 + 1) {
            bVar15 = *(byte *)(*(long *)(pcVar9 + (long)piVar11[uVar32 * 2 + 1] * 8) +
                              (ulong)(uVar18 >> 1));
            bVar38 = bVar15 >> 4;
            if ((uVar18 & 1) == 0) {
              bVar38 = bVar15 & 0xf;
            }
            iVar42 = (uint)*(byte *)((long)&ppVar17->name + (ulong)bVar38) + piVar11[uVar32 * 2];
            uVar43 = iVar33 - iVar42;
            if (iVar33 < iVar42) {
              iVar42 = iVar33;
            }
            uVar40 = -uVar43;
            if (0 < (int)uVar43) {
              uVar40 = uVar43;
            }
            iVar33 = iVar42 - (uint)(byte)(ps[7].vt)->name[uVar40];
          }
          senone_scores[uVar18] = senone_scores[uVar18] + (short)iVar33;
        }
      }
    }
    else {
      iVar33 = ps[3].frame_idx;
      for (uVar21 = 0; (long)uVar21 < (long)((long)iVar33 & 0xfffffffffffffffeU);
          uVar21 = uVar21 + 2) {
        pcVar9 = (&(ps[2].vt)->name)[uVar28];
        piVar11 = (int *)(&(ps[6].vt)->name)[uVar28];
        bVar15 = *(byte *)(*(long *)(pcVar9 + (long)piVar11[1] * 8) + (uVar21 >> 1));
        iVar39 = (uint)*(byte *)((long)&ppVar17->name + (ulong)(bVar15 & 0xf)) + *piVar11;
        iVar42 = (uint)*(byte *)((long)&ppVar17->name + (ulong)(bVar15 >> 4)) + *piVar11;
        for (uVar32 = 1; uVar32 < uVar31; uVar32 = uVar32 + 1) {
          bVar15 = *(byte *)(*(long *)(pcVar9 + (long)piVar11[uVar32 * 2 + 1] * 8) + (uVar21 >> 1));
          iVar29 = (uint)*(byte *)((long)&ppVar17->name + (ulong)(bVar15 & 0xf)) +
                   piVar11[uVar32 * 2];
          iVar35 = (uint)*(byte *)((long)&ppVar17->name + (ulong)(bVar15 >> 4)) +
                   piVar11[uVar32 * 2];
          uVar18 = iVar39 - iVar29;
          if (iVar39 < iVar29) {
            iVar29 = iVar39;
          }
          uVar43 = -uVar18;
          if (0 < (int)uVar18) {
            uVar43 = uVar18;
          }
          pcVar13 = (ps[7].vt)->name;
          iVar39 = iVar29 - (uint)(byte)pcVar13[uVar43];
          uVar18 = iVar42 - iVar35;
          if (iVar42 < iVar35) {
            iVar35 = iVar42;
          }
          uVar43 = -uVar18;
          if (0 < (int)uVar18) {
            uVar43 = uVar18;
          }
          iVar42 = iVar35 - (uint)(byte)pcVar13[uVar43];
        }
        senone_scores[uVar21] = senone_scores[uVar21] + (short)iVar39;
        senone_scores[uVar21 + 1] = senone_scores[uVar21 + 1] + (short)iVar42;
      }
    }
    uVar28 = uVar28 + 1;
  } while( true );
LAB_0013afa2:
  for (; (piVar11 <= piVar24 && (*piVar24 <= iVar42)); piVar24 = piVar24 + -2) {
    *(undefined8 *)(piVar24 + 2) = *(undefined8 *)piVar24;
  }
  piVar24[3] = iVar39;
  piVar24[2] = iVar42;
LAB_0013afc0:
  pfVar20 = pfVar20 + 1;
  lVar16 = lVar26;
  lVar34 = lVar36;
  goto LAB_0013aee7;
}

Assistant:

int32
s2_semi_mgau_frame_eval(ps_mgau_t *ps,
                        int16 *senone_scores,
                        uint8 *senone_active,
                        int32 n_senone_active,
			mfcc_t ** featbuf, int32 frame,
			int32 compallsen)
{
    s2_semi_mgau_t *s = (s2_semi_mgau_t *)ps;
    int i, topn_idx;
    int n_feat = s->g->n_feat;

    memset(senone_scores, 0, s->n_sen * sizeof(*senone_scores));
    /* No bounds checking is done here, which just means you'll get
     * semi-random crap if you request a frame in the future or one
     * that's too far in the past. */
    topn_idx = frame % s->n_topn_hist;
    s->f = s->topn_hist[topn_idx];
    for (i = 0; i < n_feat; ++i) {
        /* For past frames this will already be computed. */
        if (frame >= ps_mgau_base(ps)->frame_idx) {
            vqFeature_t **lastf;
            if (topn_idx == 0)
                lastf = s->topn_hist[s->n_topn_hist-1];
            else
                lastf = s->topn_hist[topn_idx-1];
            memcpy(s->f[i], lastf[i], sizeof(vqFeature_t) * s->max_topn);
            mgau_dist(s, frame, i, featbuf[i]);
            s->topn_hist_n[topn_idx][i] = mgau_norm(s, i);
        }
        if (s->mixw_cb) {
            if (compallsen)
                get_scores_4b_feat_all(s, i, s->topn_hist_n[topn_idx][i], senone_scores);
            else
                get_scores_4b_feat(s, i, s->topn_hist_n[topn_idx][i], senone_scores,
                                   senone_active, n_senone_active);
        }
        else {
            if (compallsen)
                get_scores_8b_feat_all(s, i, s->topn_hist_n[topn_idx][i], senone_scores);
            else
                get_scores_8b_feat(s, i, s->topn_hist_n[topn_idx][i], senone_scores,
                                   senone_active, n_senone_active);
        }
    }

    return 0;
}